

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O3

int Abc_NtkCountInst_rec(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  void **__ptr;
  Abc_Ntk_t *pNtk_00;
  int iVar3;
  Vec_Ptr_t *__ptr_00;
  int iVar4;
  long lVar5;
  
  if (-1 < pNtk->iStep) {
    return pNtk->iStep;
  }
  __ptr_00 = Abc_NtkDfsBoxes(pNtk);
  iVar1 = __ptr_00->nSize;
  __ptr = __ptr_00->pArray;
  if ((long)iVar1 < 1) {
    iVar4 = 1;
    if (__ptr == (void **)0x0) goto LAB_0086774d;
  }
  else {
    lVar5 = 0;
    iVar4 = 0;
    do {
      uVar2 = *(uint *)((long)__ptr[lVar5] + 0x14);
      if (((uVar2 & 0xe) == 8 || (uVar2 & 0xf) == 10) &&
         (pNtk_00 = *(Abc_Ntk_t **)((long)__ptr[lVar5] + 0x38), pNtk_00 != pNtk)) {
        iVar3 = Abc_NtkCountInst_rec(pNtk_00);
        iVar4 = iVar4 + iVar3;
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
    iVar4 = iVar4 + 1;
  }
  free(__ptr);
LAB_0086774d:
  free(__ptr_00);
  pNtk->iStep = iVar4;
  return iVar4;
}

Assistant:

int Abc_NtkCountInst_rec( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vOrder;
    Abc_Obj_t * pObj;
    int i, Counter = 0;
    if ( pNtk->iStep >= 0 )
        return pNtk->iStep;
    vOrder = Abc_NtkDfsBoxes( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pObj, i )
        if ( Abc_ObjIsBox(pObj) && (Abc_Ntk_t *)pObj->pData != pNtk )
            Counter += Abc_NtkCountInst_rec( (Abc_Ntk_t *)pObj->pData );
    Vec_PtrFree( vOrder );
    return pNtk->iStep = 1 + Counter;
}